

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O2

char * GetDescriptorName(U8 descriptor)

{
  undefined4 uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = (undefined4)CONCAT71(in_register_00000039,descriptor);
  switch(uVar1) {
  case 1:
    return "DEVICE";
  case 2:
    return "CONFIGURATION";
  case 3:
    return "STRING";
  case 4:
    return "INTERFACE";
  case 5:
    return "ENDPOINT";
  case 6:
    return "DEVICE_QUALIFIER";
  case 7:
    return "OTHER_SPEED_CONFIGURATION";
  case 8:
    return "INTERFACE_POWER";
  }
  switch(uVar1) {
  case 0x21:
    return "HID";
  case 0x22:
    return "HID Report Descriptor";
  case 0x23:
    return "HID Physical Descriptor";
  case 0x24:
    return "CS_INTERFACE";
  case 0x25:
    return "CS_ENDPOINT";
  default:
    return "<unknown>";
  }
}

Assistant:

const char* GetDescriptorName( U8 descriptor )
{
    switch( descriptor )
    {
    case DT_DEVICE:
        return "DEVICE";
    case DT_CONFIGURATION:
        return "CONFIGURATION";
    case DT_STRING:
        return "STRING";
    case DT_INTERFACE:
        return "INTERFACE";
    case DT_ENDPOINT:
        return "ENDPOINT";
    case DT_DEVICE_QUALIFIER:
        return "DEVICE_QUALIFIER";
    case DT_OTHER_SPEED_CONFIGURATION:
        return "OTHER_SPEED_CONFIGURATION";
    case DT_INTERFACE_POWER:
        return "INTERFACE_POWER";

    // HID Class specific descriptors
    case DT_HID:
        return "HID";
    case DT_HID_REPORT:
        return "HID Report Descriptor";
    case DT_HID_PHYS:
        return "HID Physical Descriptor";

    // CDC Class specific descriptors
    case DT_CDC_CS_INTERFACE:
        return "CS_INTERFACE";
    case DT_CDC_CS_ENDPOINT:
        return "CS_ENDPOINT";
    }

    return "<unknown>";
}